

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ym3438.c
# Opt level: O3

void OPN2_DoTimerA(ym3438_t *chip)

{
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  byte bVar4;
  
  bVar1 = chip->timer_a_overflow;
  if (chip->cycles == 2) {
    bVar4 = (chip->timer_a_load != '\0' && chip->timer_a_load_lock == '\0') | bVar1;
    chip->timer_a_load_lock = chip->timer_a_load;
    bVar2 = 0;
    if (chip->mode_csm != '\0') {
      bVar2 = bVar4;
    }
    chip->mode_kon_csm = bVar2;
    uVar3 = chip->ch_out[(ulong)(chip->timer_a_load_latch != '\0') + 9];
    chip->timer_a_load_latch = bVar4;
LAB_0017113c:
    if (chip->mode_test_21[2] == '\0') goto LAB_00171147;
  }
  else {
    uVar3 = chip->ch_out[(ulong)(chip->timer_a_load_latch != '\0') + 9];
    chip->timer_a_load_latch = bVar1;
    if ((chip->cycles != 1) || (chip->timer_a_load_lock == '\0')) goto LAB_0017113c;
  }
  uVar3 = uVar3 + 1;
LAB_00171147:
  if (chip->timer_a_reset == '\0') {
    chip->timer_a_overflow_flag = chip->timer_a_overflow_flag | bVar1 & chip->timer_a_enable;
  }
  else {
    chip->timer_a_reset = '\0';
    chip->timer_a_overflow_flag = '\0';
  }
  chip->timer_a_overflow = (byte)(uVar3 >> 10);
  chip->timer_a_cnt = uVar3 & 0x3ff;
  return;
}

Assistant:

void OPN2_DoTimerA(ym3438_t *chip)
{
    Bit16u time;
    Bit8u load;
    load = chip->timer_a_overflow;
    if (chip->cycles == 2)
    {
        /* Lock load value */
        load |= (!chip->timer_a_load_lock && chip->timer_a_load);
        chip->timer_a_load_lock = chip->timer_a_load;
        if (chip->mode_csm)
        {
            /* CSM KeyOn */
            chip->mode_kon_csm = load;
        }
        else
        {
            chip->mode_kon_csm = 0;
        }
    }
    /* Load counter */
    if (chip->timer_a_load_latch)
    {
        time = chip->timer_a_reg;
    }
    else
    {
        time = chip->timer_a_cnt;
    }
    chip->timer_a_load_latch = load;
    /* Increase counter */
    if ((chip->cycles == 1 && chip->timer_a_load_lock) || chip->mode_test_21[2])
    {
        time++;
    }
    /* Set overflow flag */
    if (chip->timer_a_reset)
    {
        chip->timer_a_reset = 0;
        chip->timer_a_overflow_flag = 0;
    }
    else
    {
        chip->timer_a_overflow_flag |= chip->timer_a_overflow & chip->timer_a_enable;
    }
    chip->timer_a_overflow = (time >> 10);
    chip->timer_a_cnt = time & 0x3ff;
}